

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void totalFinalize(sqlite3_context *context)

{
  double *pdVar1;
  double val;
  
  if ((short)context->pMem->flags < 0) {
    pdVar1 = (double *)context->pMem->z;
  }
  else {
    pdVar1 = (double *)createAggContext(context,0);
  }
  if (pdVar1 == (double *)0x0) {
    val = 0.0;
  }
  else if (*(char *)(pdVar1 + 4) == '\0') {
    val = (double)(long)pdVar1[2];
  }
  else {
    val = *pdVar1;
    if ((ulong)ABS(pdVar1[1]) < 0x7ff0000000000000) {
      val = val + pdVar1[1];
    }
  }
  sqlite3VdbeMemSetDouble(context->pOut,val);
  return;
}

Assistant:

static void totalFinalize(sqlite3_context *context){
  SumCtx *p;
  double r = 0.0;
  p = sqlite3_aggregate_context(context, 0);
  if( p ){
    if( p->approx ){
      r = p->rSum;
      if( !sqlite3IsOverflow(p->rErr) ) r += p->rErr;
    }else{
      r = (double)(p->iSum);
    }
  }
  sqlite3_result_double(context, r);
}